

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O3

void NJD_push_node(NJD *njd,NJDNode *node)

{
  _NJDNode *p_Var1;
  NJDNode *pNVar2;
  
  if (njd->head == (NJDNode *)0x0) {
    njd->head = node;
  }
  else {
    p_Var1 = njd->tail;
    p_Var1->next = node;
    node->prev = p_Var1;
  }
  do {
    pNVar2 = node;
    node = pNVar2->next;
  } while (node != (_NJDNode *)0x0);
  njd->tail = pNVar2;
  return;
}

Assistant:

void NJD_push_node(NJD * njd, NJDNode * node)
{
   if (njd->head == NULL) {
      njd->head = node;
   } else {
      njd->tail->next = node;
      node->prev = njd->tail;
   }
   while (node->next != NULL)
      node = node->next;
   njd->tail = node;
}